

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Appearance_PDU.cpp
# Opt level: O3

void __thiscall KDIS::PDU::Appearance_PDU::SetEntityTypeFlag(Appearance_PDU *this,KBOOL F)

{
  if ((((this->m_AppearanceFlag1Union).m_ui8Flag & 2) == 0) == F) {
    (this->m_AppearanceFlag1Union).m_ui8Flag =
         (this->m_AppearanceFlag1Union).m_ui8Flag & 0xfd | F * '\x02';
    (this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength =
         ((ushort)F * 0x10 + (this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength) - 8
    ;
  }
  return;
}

Assistant:

void Appearance_PDU::SetEntityTypeFlag( KBOOL F )
{
    if( ( KUINT8 )F == m_AppearanceFlag1Union.m_ui8Typ )return;

    m_AppearanceFlag1Union.m_ui8Typ = F;

    if( F )
    {
        m_ui16PDULength += EntityType::ENTITY_TYPE_SIZE;
    }
    else
    {
        m_ui16PDULength -= EntityType::ENTITY_TYPE_SIZE;
    }
}